

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Decode
          (Directed_Energy_Fire_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  StandardVariable *pSVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  ushort uVar6;
  pointer pKVar7;
  KUINT32 datumID;
  KString local_60;
  uint local_3c;
  KUINT16 *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar3 < 0x58) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Decode","");
    KException::KException(this_00,&local_60,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vDeRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar7 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar7->_vptr_KRef_Ptr)(pKVar7);
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar2);
    (this->m_vDeRec).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_FiringEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EventID,stream);
  (*(this->m_MunTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MunTyp,stream);
  (*(this->m_ShotStartTime).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ShotStartTime,stream)
  ;
  KDataStream::Read<float>(stream,(float *)&this->m_f32CumulativeShotTime);
  (*(this->m_EmitterLoc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EmitterLoc,stream);
  KDataStream::Read<float>(stream,(float *)&this->m_f32AperDiameter);
  KDataStream::Read<float>(stream,(float *)&this->m_f32Wavelength);
  KDataStream::Read<float>(stream,(float *)&this->m_f32PeakIrradiance);
  KDataStream::Read<float>(stream,(float *)&this->m_f32PulseRepFreq);
  KDataStream::Read<float>(stream,(float *)&this->m_f32PulseWidth);
  KDataStream::Read<unsigned_short>(stream,&(this->m_DeUnion).m_ui16Flags);
  KDataStream::Read(stream,&this->m_ui8PulseShp);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding2);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding3);
  local_38 = &this->m_ui16NumDERecs;
  KDataStream::Read<unsigned_short>(stream,local_38);
  if (this->m_ui16NumDERecs != 0) {
    uVar6 = 0;
    do {
      KVar3 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&local_3c);
      KDataStream::SetCurrentWritePosition(stream,KVar3);
      pSVar4 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
                         (local_3c,stream);
      if (pSVar4 == (StandardVariable *)0x0) {
        pSVar4 = (StandardVariable *)operator_new(0x10);
        DATA_TYPE::StandardVariable::StandardVariable(pSVar4,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022aeb8;
        local_60._M_string_length = (size_type)pSVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)&this->m_vDeRec,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_60);
      }
      else {
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022aeb8;
        local_60._M_string_length = (size_type)pSVar4;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                    *)&this->m_vDeRec,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_60);
      }
      local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022aeb8;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_60);
      uVar6 = uVar6 + 1;
    } while (uVar6 < *local_38);
  }
  return;
}

Assistant:

void Directed_Energy_Fire_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DIRECTED_ENERGY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vDeRec.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_FiringEntityID
           >> KDIS_STREAM m_EventID
           >> KDIS_STREAM m_MunTyp
           >> KDIS_STREAM m_ShotStartTime
           >> m_f32CumulativeShotTime
           >> KDIS_STREAM m_EmitterLoc
           >> m_f32AperDiameter
           >> m_f32Wavelength
           >> m_f32PeakIrradiance
           >> m_f32PulseRepFreq
           >> m_f32PulseWidth
           >> m_DeUnion.m_ui16Flags
           >> m_ui8PulseShp
           >> m_ui8Padding1
           >> m_ui32Padding2
           >> m_ui16Padding3
           >> m_ui16NumDERecs;

    for( KUINT16 i = 0; i < m_ui16NumDERecs; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        StandardVariable * p = StandardVariable::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vDeRec.push_back( StdVarPtr( p ) );
        }
        else
        {
            // Default
            m_vDeRec.push_back( StdVarPtr( new StandardVariable( stream ) ) );
        }
    }
}